

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdir.cpp
# Opt level: O0

void __thiscall
QDir::QDir(QDir *this,QString *path,QString *nameFilter,SortFlags sort,Filters filters)

{
  QString *nameFilter_00;
  undefined4 in_ECX;
  QSharedDataPointer<QDirPrivate> *in_RDI;
  undefined4 in_R8D;
  long in_FS_OFFSET;
  QDirPrivate *unaff_retaddr;
  Filters in_stack_00000078;
  SortFlags in_stack_0000007c;
  QDirPrivate *in_stack_ffffffffffffff88;
  QString *path_00;
  
  path_00 = *(QString **)(in_FS_OFFSET + 0x28);
  nameFilter_00 = (QString *)operator_new(0x118);
  nameFiltersFromString(nameFilter_00);
  QDirPrivate::QDirPrivate
            (unaff_retaddr,path_00,(QStringList *)CONCAT44(in_ECX,in_R8D),in_stack_0000007c,
             in_stack_00000078);
  QSharedDataPointer<QDirPrivate>::QSharedDataPointer(in_RDI,in_stack_ffffffffffffff88);
  QList<QString>::~QList((QList<QString> *)0x27d094);
  if (*(QString **)(in_FS_OFFSET + 0x28) == path_00) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QDir::QDir(const QString &path, const QString &nameFilter,
           SortFlags sort, Filters filters)
    : d_ptr(new QDirPrivate(path, QDir::nameFiltersFromString(nameFilter), sort, filters))
{
}